

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.c
# Opt level: O2

ssize_t mpt_memcpy(ssize_t len,iovec *src,size_t nsrc,iovec *dest,size_t ndest)

{
  long lVar1;
  size_t *psVar2;
  size_t sVar3;
  size_t sVar4;
  void *__dest;
  void *__src;
  size_t sVar5;
  ulong __n;
  bool bVar6;
  
  if (nsrc == 0 || ndest == 0) {
    return 0;
  }
  __src = src->iov_base;
  sVar5 = src->iov_len;
  __dest = dest->iov_base;
  sVar4 = dest->iov_len;
  if (0 < len) {
    lVar1 = nsrc - 1;
    psVar2 = &src[1].iov_len;
    sVar3 = sVar5;
    while (bVar6 = lVar1 != 0, lVar1 = lVar1 + -1, bVar6) {
      sVar3 = sVar3 + *psVar2;
      psVar2 = psVar2 + 2;
    }
    if ((long)sVar3 < len) {
      return -1;
    }
    lVar1 = ndest - 1;
    psVar2 = &dest[1].iov_len;
    sVar3 = sVar4;
    while (bVar6 = lVar1 != 0, lVar1 = lVar1 + -1, bVar6) {
      sVar3 = sVar3 + *psVar2;
      psVar2 = psVar2 + 2;
    }
    if ((long)sVar3 < len) {
      return -2;
    }
  }
  lVar1 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        if (len == 0) {
          return lVar1;
        }
        if (sVar5 != 0) break;
        nsrc = nsrc - 1;
        if (nsrc == 0) {
          return lVar1;
        }
        __src = src[1].iov_base;
        sVar5 = src[1].iov_len;
        src = src + 1;
      }
      if (sVar4 == 0) break;
      __n = len;
      if (sVar5 < (ulong)len) {
        __n = sVar5;
      }
      if (sVar4 < __n) {
        __n = sVar4;
      }
      memcpy(__dest,__src,__n);
      __src = (void *)((long)__src + __n);
      sVar5 = sVar5 - __n;
      __dest = (void *)((long)__dest + __n);
      sVar4 = sVar4 - __n;
      lVar1 = lVar1 + __n;
      len = len - __n;
    }
    if (ndest == 1) break;
    __dest = dest[1].iov_base;
    sVar4 = dest[1].iov_len;
    dest = dest + 1;
    ndest = ndest - 1;
  }
  return lVar1;
}

Assistant:

extern ssize_t mpt_memcpy(ssize_t len,
			  const struct iovec *src,  size_t nsrc,
			  const struct iovec *dest, size_t ndest)
{
	int8_t	*source, *target;
	size_t	total = 0, left, space;
	
	if (!ndest || !nsrc)
		return 0;
	
	source = src->iov_base;
	left   = src->iov_len;
	
	target = dest->iov_base;
	space  = dest->iov_len;
	
	/* check maximum size */
	if (len > 0) {
		size_t pos;
		for (total = left,  pos = 1; pos < nsrc;  ++pos) total += src[pos].iov_len;
		if (len > (ssize_t) total) return -1;
		for (total = space, pos = 1; pos < ndest; ++pos) total += dest[pos].iov_len;
		if (len > (ssize_t) total) return -2;
	}
	total = 0;
	
	while (len) {
		size_t copy = len;
		if (!left) {
			if (!(--nsrc)) break;
			++src;
			source = src->iov_base;
			left   = src->iov_len;
			continue;
		}
		if (!space) {
			if (!(--ndest)) break;
			++dest;
			target = dest->iov_base;
			space  = dest->iov_len;
			continue;
		}
		if (left  < copy) copy = left;
		if (space < copy) copy = space;
		
		memcpy(target, source, copy);
		
		source += copy;
		left   -= copy;
		
		target += copy;
		space  -= copy;
		
		total += copy;
		len   -= copy;
	}
	return total;
}